

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O2

StackData * __thiscall
chaiscript::detail::Dispatch_Engine::get_stack_data_abi_cxx11_(Dispatch_Engine *this)

{
  Stack_Holder *pSVar1;
  
  pSVar1 = threading::Thread_Storage<chaiscript::detail::Stack_Holder>::operator->
                     (&this->m_stack_holder);
  return (pSVar1->stacks).
         super__Vector_base<std::vector<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>,_std::allocator<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>_>_>,_std::allocator<std::vector<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>,_std::allocator<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
}

Assistant:

StackData &get_stack_data() noexcept { return m_stack_holder->stacks.back(); }